

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O1

int rtosc_arg_val_to_int(rtosc_arg_val_t *av,int *res)

{
  char cVar1;
  int iVar2;
  
  cVar1 = av->type;
  iVar2 = 0;
  switch(cVar1) {
  case 'c':
  case 'h':
  case 'i':
    iVar2 = (av->val).i;
    break;
  case 'd':
    iVar2 = (int)(av->val).d;
    break;
  case 'e':
  case 'g':
    goto switchD_001111fc_caseD_65;
  case 'f':
    iVar2 = (int)(av->val).f;
    break;
  default:
    if ((cVar1 != 'F') && (cVar1 != 'T')) {
      return 0;
    }
    iVar2 = (int)(av->val).T;
  }
  *res = iVar2;
  iVar2 = 1;
switchD_001111fc_caseD_65:
  return iVar2;
}

Assistant:

int rtosc_arg_val_to_int(const rtosc_arg_val_t* av, int* res)
{
    switch(av->type)
    {
        case 'd': *res = av->val.d; return true;
        case 'f': *res = av->val.f; return true;
        case 'h': *res = av->val.h; return true;
        case 'c':
        case 'i': *res = av->val.i; return true;
        case 'T':
        case 'F':
            *res = av->val.T; return true;
        default: return false;
    }
}